

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon_maps.c
# Opt level: O1

void rotate_dungeons(dw_rom *rom)

{
  short sVar2;
  dw_map_index town;
  dw_map_meta *pdVar3;
  dw_warp *pdVar4;
  dw_map_meta *pdVar5;
  dw_chest *pdVar6;
  dwr_spike_table *pdVar7;
  dw_dungeon_tile dVar8;
  uint64_t uVar9;
  ulong uVar10;
  undefined1 *__ptr;
  ulong uVar11;
  undefined1 *puVar12;
  uint8_t *puVar13;
  long lVar14;
  ulong uVar15;
  byte bVar16;
  uint uVar17;
  undefined1 *puVar18;
  uint8_t uVar19;
  uint uVar20;
  uint8_t uVar21;
  uint8_t uVar22;
  byte bVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  bool bVar27;
  uint local_70;
  ushort uVar1;
  
  if ((rom->flags[10] & 0xc) != 0) {
    puts("Rotating and mirroring dungeons...");
    lVar26 = 0;
    do {
      town = (&DAT_00176d80)[lVar26];
      pdVar3 = (rom->map).meta;
      uVar19 = pdVar3[town].width;
      uVar21 = pdVar3[town].height;
      uVar9 = mt_rand(0,0xf);
      if ((uVar9 & 0xff) != 0 || lVar26 != 6) {
        bVar16 = uVar19 + 1;
        bVar23 = uVar21 + 1;
        uVar10 = (ulong)bVar16;
        uVar20 = (uint)bVar23 * (uint)bVar16;
        uVar15 = (ulong)uVar20;
        __ptr = (undefined1 *)calloc(uVar15,1);
        uVar11 = (ulong)bVar23;
        local_70 = (uint)bVar16;
        if (bVar23 != 0) {
          uVar24 = 0;
          puVar18 = __ptr;
          do {
            if (local_70 != 0) {
              uVar25 = 0;
              do {
                dVar8 = get_dungeon_tile(rom,town,(uint8_t)uVar25,(uint8_t)uVar24);
                puVar18[uVar25] = (char)dVar8;
                uVar25 = uVar25 + 1;
              } while (uVar10 != uVar25);
            }
            uVar24 = uVar24 + 1;
            puVar18 = puVar18 + uVar10;
          } while (uVar24 != uVar11);
        }
        if ((uVar9 & 4) != 0) {
          puVar18 = (undefined1 *)calloc(uVar15,1);
          if (uVar15 != 0) {
            uVar24 = 0;
            do {
              puVar18[uVar24] = __ptr[(long)(int)(local_70 - 1) + (uVar24 % uVar10) * -2 + uVar24];
              uVar24 = uVar24 + 1;
            } while (uVar15 != uVar24);
          }
          free(__ptr);
          __ptr = puVar18;
        }
        if ((uVar9 & 8) != 0) {
          puVar18 = (undefined1 *)calloc(uVar15,1);
          if (uVar15 != 0) {
            uVar24 = 0;
            do {
              puVar18[uVar24] =
                   __ptr[((long)(int)(bVar23 - 1) - uVar24 / uVar10) * uVar10 + uVar24 % uVar10];
              uVar24 = uVar24 + 1;
            } while (uVar15 != uVar24);
          }
          free(__ptr);
          __ptr = puVar18;
        }
        uVar17 = (uint)uVar9 & 3;
        if ((uVar9 & 3) != 0) {
          puVar18 = (undefined1 *)calloc(uVar15,1);
          if (uVar17 == 1) {
            if (uVar20 != 0) {
              uVar24 = 0;
              do {
                puVar18[uVar24] =
                     __ptr[((long)(int)(bVar23 - 1) - uVar24 % uVar11) * uVar10 + uVar24 / uVar11];
                uVar24 = uVar24 + 1;
              } while (uVar15 != uVar24);
            }
          }
          else if (uVar17 == 2) {
            puVar12 = puVar18;
            if (uVar20 != 0) {
              do {
                *puVar12 = __ptr[uVar15 - 1];
                puVar12 = puVar12 + 1;
                uVar15 = uVar15 - 1;
              } while (uVar15 != 0);
            }
          }
          else if (uVar20 != 0) {
            uVar24 = 0;
            do {
              puVar18[uVar24] =
                   __ptr[(uVar24 % uVar11) * uVar10 + ((long)(int)(local_70 - 1) - uVar24 / uVar11)]
              ;
              uVar24 = uVar24 + 1;
            } while (uVar15 != uVar24);
          }
          free(__ptr);
          __ptr = puVar18;
        }
        pdVar4 = (rom->map).warps_from;
        lVar14 = (long)(rom->map).warps_to - (long)pdVar4;
        if (lVar14 != 0) {
          lVar14 = lVar14 * 0x5555555555555556;
          pdVar5 = (rom->map).meta;
          lVar14 = lVar14 + (ulong)(lVar14 == 0);
          puVar13 = &pdVar4->y;
          do {
            if (town == ((dw_warp *)(puVar13 + -2))->map) {
              uVar19 = puVar13[-1];
              if ((uVar9 & 4) != 0) {
                uVar19 = pdVar5[town].width - uVar19;
              }
              uVar21 = *puVar13;
              if ((uVar9 & 8) != 0) {
                uVar21 = pdVar5[town].height - uVar21;
              }
              uVar22 = uVar19;
              if (uVar17 == 1) {
                uVar22 = pdVar5[town].height - uVar21;
                uVar21 = uVar19;
              }
              if (uVar17 == 2) {
                uVar22 = pdVar5[town].width - uVar22;
                uVar21 = pdVar5[town].height - uVar21;
              }
              if (uVar17 == 3) {
                uVar19 = pdVar5[town].width - uVar22;
                uVar22 = uVar21;
                uVar21 = uVar19;
              }
              puVar13[-1] = uVar22;
              *puVar13 = uVar21;
            }
            puVar13 = puVar13 + 3;
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
        }
        pdVar5 = (rom->map).meta;
        pdVar6 = rom->chests;
        lVar14 = 0;
        do {
          if (town == pdVar6[lVar14].map) {
            uVar19 = pdVar6[lVar14].x;
            if ((uVar9 & 4) != 0) {
              uVar19 = pdVar5[town].width - uVar19;
            }
            uVar21 = pdVar6[lVar14].y;
            if ((uVar9 & 8) != 0) {
              uVar21 = pdVar5[town].height - uVar21;
            }
            uVar22 = uVar19;
            if (uVar17 == 1) {
              uVar22 = pdVar5[town].height - uVar21;
              uVar21 = uVar19;
            }
            if (uVar17 == 2) {
              uVar22 = pdVar5[town].width - uVar22;
              uVar21 = pdVar5[town].height - uVar21;
            }
            if (uVar17 == 3) {
              uVar19 = pdVar5[town].width - uVar22;
              uVar22 = uVar21;
              uVar21 = uVar19;
            }
            pdVar6[lVar14].x = uVar22;
            pdVar6[lVar14].y = uVar21;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0x1f);
        if (lVar26 == 6) {
          pdVar7 = rom->spike_table;
          uVar19 = pdVar7->x[1];
          if ((uVar9 & 4) != 0) {
            uVar19 = pdVar5[0x15].width - uVar19;
          }
          uVar21 = pdVar7->y[1];
          if ((uVar9 & 8) != 0) {
            uVar21 = pdVar5[0x15].height - uVar21;
          }
          uVar22 = uVar19;
          if (uVar17 == 1) {
            uVar22 = pdVar5[0x15].height - uVar21;
            uVar21 = uVar19;
          }
          if (uVar17 == 2) {
            uVar22 = pdVar5[0x15].width - uVar22;
            uVar21 = pdVar5[0x15].height - uVar21;
          }
          if (uVar17 == 3) {
            uVar19 = pdVar5[0x15].width - uVar22;
            uVar22 = uVar21;
            uVar21 = uVar19;
          }
          pdVar7->x[1] = uVar22;
          rom->spike_table->y[1] = uVar21;
        }
        if ((uVar9 & 1) != 0) {
          pdVar5 = pdVar3 + town;
          sVar2._0_1_ = pdVar5->width;
          sVar2._1_1_ = pdVar5->height;
          uVar1._0_1_ = pdVar5->width;
          uVar1._1_1_ = pdVar5->height;
          uVar1 = sVar2 << 8 | uVar1 >> 8;
          pdVar5->width = (char)uVar1;
          pdVar5->height = (char)(uVar1 >> 8);
        }
        uVar10 = 0;
        do {
          uVar15 = (ulong)pdVar3[town].width;
          uVar11 = 0;
          do {
            set_dungeon_tile(rom,town,(uint8_t)uVar11,(uint8_t)uVar10,
                             __ptr[uVar11 + (uVar15 + 1) * uVar10]);
            uVar15 = (ulong)pdVar3[town].width;
            bVar27 = uVar11 < uVar15;
            uVar11 = uVar11 + 1;
          } while (bVar27);
          bVar27 = uVar10 < pdVar3[town].height;
          uVar10 = uVar10 + 1;
        } while (bVar27);
        free(__ptr);
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 != 0xf);
  }
  return;
}

Assistant:

void rotate_dungeons(dw_rom *rom)
{
    size_t i;
    dw_map_index to_rotate[] = {
//         OVERWORLD,
//         CHARLOCK,
//         HAUKSNESS,
//         TANTEGEL,
//         TANTEGEL_THRONE_ROOM,
//         CHARLOCK_THRONE_ROOM,
//         KOL,
//         BRECCONARY,
//         GARINHAM,
//         CANTLIN,
//         RIMULDAR,
//         TANTEGEL_BASEMENT,
//         NORTHERN_SHRINE,
//         SOUTHERN_SHRINE,

        CHARLOCK_CAVE_1,
        CHARLOCK_CAVE_2,
        CHARLOCK_CAVE_3,
        CHARLOCK_CAVE_4,
        CHARLOCK_CAVE_5,
        CHARLOCK_CAVE_6,
        SWAMP_CAVE,
        MOUNTAIN_CAVE,
        MOUNTAIN_CAVE_2,
        GARINS_GRAVE_1,
        GARINS_GRAVE_2,
        GARINS_GRAVE_3,
        GARINS_GRAVE_4,
        ERDRICKS_CAVE,
        ERDRICKS_CAVE_2,
    };

    if (ROTATE_DUNGEONS(rom)) {
        printf("Rotating and mirroring dungeons...\n");

        for (i=0; i < sizeof(to_rotate) / sizeof(dw_map_index); i++) {
            rotate_mirror_map(rom, to_rotate[i]);
        }
    }
}